

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport.c
# Opt level: O2

void nni_sp_tran_register(nni_sp_tran *tran)

{
  int iVar1;
  nni_sp_pipe_ops *pnVar2;
  nni_sp_dialer_ops *pnVar3;
  nni_sp_listener_ops *pnVar4;
  
  pnVar2 = tran->tran_pipe;
  if (pnVar2->p_size == 0) {
    nni_panic("%s: %d: assert err: %s",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport.c",
              0x18,"tran->tran_pipe->p_size != 0");
    pnVar2 = tran->tran_pipe;
  }
  if (pnVar2->p_init == (_func_int_void_ptr_nni_pipe_ptr *)0x0) {
    nni_panic("%s: %d: assert err: %s",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport.c",
              0x19,"tran->tran_pipe->p_init != NULL");
    pnVar2 = tran->tran_pipe;
  }
  if (pnVar2->p_fini == (_func_void_void_ptr *)0x0) {
    nni_panic("%s: %d: assert err: %s",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport.c",
              0x1a,"tran->tran_pipe->p_fini != NULL");
    pnVar2 = tran->tran_pipe;
  }
  if (pnVar2->p_stop == (_func_void_void_ptr *)0x0) {
    nni_panic("%s: %d: assert err: %s",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport.c",
              0x1b,"tran->tran_pipe->p_stop != NULL");
    pnVar2 = tran->tran_pipe;
  }
  if (pnVar2->p_close == (_func_void_void_ptr *)0x0) {
    nni_panic("%s: %d: assert err: %s",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport.c",
              0x1c,"tran->tran_pipe->p_close != NULL");
    pnVar2 = tran->tran_pipe;
  }
  if (pnVar2->p_send == (_func_void_void_ptr_nni_aio_ptr *)0x0) {
    nni_panic("%s: %d: assert err: %s",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport.c",
              0x1d,"tran->tran_pipe->p_send != NULL");
    pnVar2 = tran->tran_pipe;
  }
  if (pnVar2->p_recv == (_func_void_void_ptr_nni_aio_ptr *)0x0) {
    nni_panic("%s: %d: assert err: %s",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport.c",
              0x1e,"tran->tran_pipe->p_recv != NULL");
    pnVar2 = tran->tran_pipe;
  }
  if (pnVar2->p_peer == (_func_uint16_t_void_ptr *)0x0) {
    nni_panic("%s: %d: assert err: %s",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport.c",
              0x1f,"tran->tran_pipe->p_peer != NULL");
  }
  pnVar3 = tran->tran_dialer;
  if (pnVar3 != (nni_sp_dialer_ops *)0x0) {
    if (pnVar3->d_size == 0) {
      nni_panic("%s: %d: assert err: %s",
                "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport.c"
                ,0x22,"tran->tran_dialer->d_size != 0");
      pnVar3 = tran->tran_dialer;
    }
    if (pnVar3->d_init == (_func_int_void_ptr_nng_url_ptr_nni_dialer_ptr *)0x0) {
      nni_panic("%s: %d: assert err: %s",
                "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport.c"
                ,0x23,"tran->tran_dialer->d_init != NULL");
      pnVar3 = tran->tran_dialer;
    }
    if (pnVar3->d_fini == (_func_void_void_ptr *)0x0) {
      nni_panic("%s: %d: assert err: %s",
                "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport.c"
                ,0x24,"tran->tran_dialer->d_fini != NULL");
      pnVar3 = tran->tran_dialer;
    }
    if (pnVar3->d_close == (_func_void_void_ptr *)0x0) {
      nni_panic("%s: %d: assert err: %s",
                "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport.c"
                ,0x25,"tran->tran_dialer->d_close != NULL");
      pnVar3 = tran->tran_dialer;
    }
    if (pnVar3->d_stop == (_func_void_void_ptr *)0x0) {
      nni_panic("%s: %d: assert err: %s",
                "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport.c"
                ,0x26,"tran->tran_dialer->d_stop != NULL");
      pnVar3 = tran->tran_dialer;
    }
    if (pnVar3->d_connect == (_func_void_void_ptr_nni_aio_ptr *)0x0) {
      nni_panic("%s: %d: assert err: %s",
                "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport.c"
                ,0x27,"tran->tran_dialer->d_connect != NULL");
      pnVar3 = tran->tran_dialer;
    }
    if (pnVar3->d_getopt == (_func_int_void_ptr_char_ptr_void_ptr_size_t_ptr_nni_type *)0x0) {
      nni_panic("%s: %d: assert err: %s",
                "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport.c"
                ,0x28,"tran->tran_dialer->d_getopt != NULL");
      pnVar3 = tran->tran_dialer;
    }
    if (pnVar3->d_setopt == (_func_int_void_ptr_char_ptr_void_ptr_size_t_nni_type *)0x0) {
      nni_panic("%s: %d: assert err: %s",
                "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport.c"
                ,0x29,"tran->tran_dialer->d_setopt != NULL");
    }
  }
  pnVar4 = tran->tran_listener;
  if (pnVar4 != (nni_sp_listener_ops *)0x0) {
    if (pnVar4->l_size == 0) {
      nni_panic("%s: %d: assert err: %s",
                "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport.c"
                ,0x2d,"tran->tran_listener->l_size != 0");
      pnVar4 = tran->tran_listener;
    }
    if (pnVar4->l_init == (_func_int_void_ptr_nng_url_ptr_nni_listener_ptr *)0x0) {
      nni_panic("%s: %d: assert err: %s",
                "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport.c"
                ,0x2e,"tran->tran_listener->l_init != NULL");
      pnVar4 = tran->tran_listener;
    }
    if (pnVar4->l_fini == (_func_void_void_ptr *)0x0) {
      nni_panic("%s: %d: assert err: %s",
                "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport.c"
                ,0x2f,"tran->tran_listener->l_fini != NULL");
      pnVar4 = tran->tran_listener;
    }
    if (pnVar4->l_bind == (_func_int_void_ptr_nng_url_ptr *)0x0) {
      nni_panic("%s: %d: assert err: %s",
                "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport.c"
                ,0x30,"tran->tran_listener->l_bind != NULL");
      pnVar4 = tran->tran_listener;
    }
    if (pnVar4->l_accept == (_func_void_void_ptr_nni_aio_ptr *)0x0) {
      nni_panic("%s: %d: assert err: %s",
                "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport.c"
                ,0x31,"tran->tran_listener->l_accept != NULL");
      pnVar4 = tran->tran_listener;
    }
    if (pnVar4->l_close == (_func_void_void_ptr *)0x0) {
      nni_panic("%s: %d: assert err: %s",
                "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport.c"
                ,0x32,"tran->tran_listener->l_close != NULL");
      pnVar4 = tran->tran_listener;
    }
    if (pnVar4->l_stop == (_func_void_void_ptr *)0x0) {
      nni_panic("%s: %d: assert err: %s",
                "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport.c"
                ,0x33,"tran->tran_listener->l_stop != NULL");
      pnVar4 = tran->tran_listener;
    }
    if (pnVar4->l_getopt == (_func_int_void_ptr_char_ptr_void_ptr_size_t_ptr_nni_type *)0x0) {
      nni_panic("%s: %d: assert err: %s",
                "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport.c"
                ,0x34,"tran->tran_listener->l_getopt != NULL");
      pnVar4 = tran->tran_listener;
    }
    if (pnVar4->l_setopt == (_func_int_void_ptr_char_ptr_void_ptr_size_t_nni_type *)0x0) {
      nni_panic("%s: %d: assert err: %s",
                "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport.c"
                ,0x35,"tran->tran_listener->l_setopt != NULL");
    }
  }
  iVar1 = nni_list_node_active(&tran->tran_link);
  if (iVar1 != 0) {
    return;
  }
  (*tran->tran_init)();
  nni_list_append(&sp_tran_list,tran);
  nng_log_info("NNG-TRAN","Registered transport: %s",tran->tran_scheme);
  return;
}

Assistant:

void
nni_sp_tran_register(nni_sp_tran *tran)
{
#ifndef NDEBUG
	NNI_ASSERT(tran->tran_pipe->p_size != 0);
	NNI_ASSERT(tran->tran_pipe->p_init != NULL);
	NNI_ASSERT(tran->tran_pipe->p_fini != NULL);
	NNI_ASSERT(tran->tran_pipe->p_stop != NULL);
	NNI_ASSERT(tran->tran_pipe->p_close != NULL);
	NNI_ASSERT(tran->tran_pipe->p_send != NULL);
	NNI_ASSERT(tran->tran_pipe->p_recv != NULL);
	NNI_ASSERT(tran->tran_pipe->p_peer != NULL);

	if (tran->tran_dialer != NULL) {
		NNI_ASSERT(tran->tran_dialer->d_size != 0);
		NNI_ASSERT(tran->tran_dialer->d_init != NULL);
		NNI_ASSERT(tran->tran_dialer->d_fini != NULL);
		NNI_ASSERT(tran->tran_dialer->d_close != NULL);
		NNI_ASSERT(tran->tran_dialer->d_stop != NULL);
		NNI_ASSERT(tran->tran_dialer->d_connect != NULL);
		NNI_ASSERT(tran->tran_dialer->d_getopt != NULL);
		NNI_ASSERT(tran->tran_dialer->d_setopt != NULL);
	}

	if (tran->tran_listener != NULL) {
		NNI_ASSERT(tran->tran_listener->l_size != 0);
		NNI_ASSERT(tran->tran_listener->l_init != NULL);
		NNI_ASSERT(tran->tran_listener->l_fini != NULL);
		NNI_ASSERT(tran->tran_listener->l_bind != NULL);
		NNI_ASSERT(tran->tran_listener->l_accept != NULL);
		NNI_ASSERT(tran->tran_listener->l_close != NULL);
		NNI_ASSERT(tran->tran_listener->l_stop != NULL);
		NNI_ASSERT(tran->tran_listener->l_getopt != NULL);
		NNI_ASSERT(tran->tran_listener->l_setopt != NULL);
	}
#endif

	if (!nni_list_node_active(&tran->tran_link)) {
		tran->tran_init();
		nni_list_append(&sp_tran_list, tran);
		nng_log_info(
		    "NNG-TRAN", "Registered transport: %s", tran->tran_scheme);
	}
}